

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::double_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,double_writer *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  size_t sVar2;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar3;
  ulong uVar4;
  char __tmp;
  ulong uVar5;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar6;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar8 = (ulong)spec->width_;
  sVar2 = f->buffer->size_;
  uVar11 = (ulong)(f->sign != '\0');
  uVar9 = sVar2 + uVar11;
  uVar14 = uVar8 - uVar9;
  if (uVar8 < uVar9 || uVar14 == 0) {
LAB_0015ef7e:
    double_writer::operator()
              ((double_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
            *)&spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar13 = uVar14 >> 1;
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar9 = *(ulong *)(this + 8);
    uVar5 = *(ulong *)(this + 0x10);
    bVar7 = this[0x18];
    uVar4 = uVar5;
    uVar10 = uVar13;
    bVar6 = bVar7;
    if (1 < uVar14) {
      do {
        bVar7 = bVar1;
        if (uVar4 < uVar9) {
          *pbVar3 = bVar1;
          pbVar3 = pbVar3 + 1;
          bVar7 = bVar6;
        }
        uVar10 = uVar10 - 1;
        uVar4 = uVar4 + 1;
        bVar6 = bVar7;
      } while (uVar10 != 0);
      uVar5 = uVar5 + uVar13;
    }
    *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
      **)this = pbVar3;
    *(ulong *)(this + 8) = uVar9;
    *(ulong *)(this + 0x10) = uVar5;
    this[0x18] = bVar7;
    double_writer::operator()
              ((double_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar5 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    bVar7 = this[0x18];
    uVar14 = uVar14 - uVar13;
    if (uVar14 == 0) goto LAB_0015f06c;
    lVar12 = (sVar2 + uVar13 + uVar11) - uVar8;
    uVar9 = uVar4;
    do {
      bVar6 = bVar1;
      if (uVar9 < uVar5) {
        *pbVar3 = bVar1;
        pbVar3 = pbVar3 + 1;
        bVar6 = bVar7;
      }
      bVar7 = bVar6;
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar11 = *(ulong *)(this + 8);
      uVar5 = *(ulong *)(this + 0x10);
      bVar7 = this[0x18];
      if (uVar14 != 0) {
        lVar12 = uVar9 - uVar8;
        uVar9 = uVar5;
        bVar6 = bVar7;
        do {
          bVar7 = bVar1;
          if (uVar9 < uVar11) {
            *pbVar3 = bVar1;
            pbVar3 = pbVar3 + 1;
            bVar7 = bVar6;
          }
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 1;
          bVar6 = bVar7;
        } while (lVar12 != 0);
        uVar5 = uVar5 + uVar14;
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar3;
      *(ulong *)(this + 8) = uVar11;
      *(ulong *)(this + 0x10) = uVar5;
      this[0x18] = bVar7;
      goto LAB_0015ef7e;
    }
    double_writer::operator()
              ((double_writer *)f,
               (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)this);
    pbVar3 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               **)this;
    uVar5 = *(ulong *)(this + 8);
    uVar4 = *(ulong *)(this + 0x10);
    bVar7 = this[0x18];
    if (uVar14 == 0) goto LAB_0015f06c;
    lVar12 = uVar9 - uVar8;
    uVar9 = uVar4;
    bVar6 = bVar7;
    do {
      bVar7 = bVar1;
      if (uVar9 < uVar5) {
        *pbVar3 = bVar1;
        pbVar3 = pbVar3 + 1;
        bVar7 = bVar6;
      }
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 1;
      bVar6 = bVar7;
    } while (lVar12 != 0);
  }
  uVar4 = uVar4 + uVar14;
LAB_0015f06c:
  *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
    **)this = pbVar3;
  *(ulong *)(this + 8) = uVar5;
  *(ulong *)(this + 0x10) = uVar4;
  this[0x18] = bVar7;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }